

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

MinMax<signed_char> Omega_h::get_minmax<signed_char>(CommPtr *comm,Read<signed_char> *a)

{
  char cVar1;
  MinMax<signed_char> MVar2;
  Write<signed_char> local_60;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_50;
  Write<signed_char> local_40;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<signed_char>::Write(&local_40,&a->write_);
  MVar2.min = get_min<signed_char>((CommPtr *)&local_30,(Read<signed_char> *)&local_40);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<signed_char>::Write(&local_60,&a->write_);
  cVar1 = get_max<signed_char>((CommPtr *)&local_50,(Read<signed_char> *)&local_60);
  Write<signed_char>::~Write(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  Write<signed_char>::~Write(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  MVar2.max = cVar1;
  return MVar2;
}

Assistant:

MinMax<T> get_minmax(CommPtr comm, Read<T> a) {
  return {get_min(comm, a), get_max(comm, a)};
}